

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFSCharter.cpp
# Opt level: O1

bool __thiscall FSCConnection::InitCurl(FSCConnection *this)

{
  CURL *pCVar1;
  bool bVar2;
  curl_slist *pcVar3;
  LTError *this_00;
  char chBuf [2048];
  char local_818 [2048];
  
  bVar2 = LTOnlineChannel::InitCurl((LTOnlineChannel *)this);
  if (!bVar2) {
    return bVar2;
  }
  if (this->pCurlHeader != (curl_slist *)0x0) {
    curl_slist_free_all();
  }
  this->pCurlHeader = (curl_slist *)0x0;
  if (((this->token)._M_string_length != 0) && ((this->token_type)._M_string_length != 0)) {
    snprintf(local_818,0x800,"Authorization: %s %s",(this->token_type)._M_dataplus._M_p,
             (this->token)._M_dataplus._M_p);
    pcVar3 = (curl_slist *)curl_slist_append(this->pCurlHeader,local_818);
    this->pCurlHeader = pcVar3;
  }
  pcVar3 = (curl_slist *)curl_slist_append(this->pCurlHeader,"Content-Type: application/json");
  this->pCurlHeader = pcVar3;
  if (pcVar3 == (curl_slist *)0x0) {
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFSCharter.cpp"
                     ,0x89,"InitCurl",logFATAL,"ASSERT FAILED: %s","pCurlHeader");
  }
  else {
    pcVar3 = (curl_slist *)curl_slist_append(pcVar3,"Accept: application/json");
    this->pCurlHeader = pcVar3;
    pCVar1 = (this->super_LTFlightDataChannel).super_LTOnlineChannel.pCurl;
    if (pCVar1 != (CURL *)0x0) {
      curl_easy_setopt(pCVar1,0x2727,pcVar3);
      return bVar2;
    }
    this_00 = (LTError *)__cxa_allocate_exception(0x18);
    LTError::LTError(this_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTFSCharter.cpp"
                     ,0x8d,"InitCurl",logFATAL,"ASSERT FAILED: %s","pCurl");
  }
  __cxa_throw(this_00,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

bool FSCConnection::InitCurl ()
{
    // Standard-init first (repeated call will just return true without effect)
    if (!LTOnlineChannel::InitCurl())
        return false;
    
    // if there is a header already remove it first
    if (pCurlHeader)
        curl_slist_free_all(pCurlHeader);
    pCurlHeader = nullptr;
    
    // if we have a token then we add it to the header
    if ( !token.empty() && !token_type.empty() ) {
        char chBuf[2048];
        snprintf(chBuf, sizeof(chBuf), FSC_HEADER_AUTHORIZATION,
                 token_type.c_str(),
                 token.c_str());
        pCurlHeader = curl_slist_append(pCurlHeader, chBuf);
    }
    
    // we always need to say that we send/receive JSON format
    pCurlHeader = curl_slist_append(pCurlHeader, FSC_HEADER_JSON_SEND);
    LOG_ASSERT(pCurlHeader);
    pCurlHeader = curl_slist_append(pCurlHeader, FSC_HEADER_JSON_ACCEPT);
    
    // set the header
    LOG_ASSERT(pCurl);
    curl_easy_setopt(pCurl, CURLOPT_HTTPHEADER, pCurlHeader);
    return true;
}